

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O1

void __thiscall
slang::ast::ASTVisitor<register_has_no_reset::AlwaysFFVisitor,_true,_true,_false,_false>::
visit<slang::ast::AssignmentExpression>
          (ASTVisitor<register_has_no_reset::AlwaysFFVisitor,_true,_true,_false,_false> *this,
          AssignmentExpression *t)

{
  bool bVar1;
  
  bVar1 = Expression::bad(&t->super_Expression);
  if (!bVar1) {
    bVar1 = LookupLhsIdentifier::hasIdentifier((string_view *)this,t);
    if (bVar1) {
      this[0x22] = (ASTVisitor<register_has_no_reset::AlwaysFFVisitor,_true,_true,_false,_false>)0x1
      ;
    }
  }
  return;
}

Assistant:

void visit(const T& t) {
        if constexpr (!VisitBad && requires { t.bad(); }) {
            if (t.bad())
                return;
        }

        if constexpr (requires { (DERIVED).handle(t); })
            (DERIVED).handle(t);
        else if constexpr (requires { (DERIVED)(DERIVED, t); })
            (DERIVED)(DERIVED, t);
        else
            visitDefault(t);
    }